

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *pIVar2;
  bool bVar3;
  
  if ((flags & 4U) != 0) {
    return GImGui->NavWindow != (ImGuiWindow *)0x0;
  }
  pIVar1 = GImGui->CurrentWindow;
  if (pIVar1 != (ImGuiWindow *)0x0) {
    pIVar2 = GImGui->NavWindow;
    switch(flags & 3) {
    case 0:
      return pIVar2 == pIVar1;
    case 1:
      if (pIVar2 != (ImGuiWindow *)0x0) {
        if (pIVar2->RootWindow == pIVar1) {
          return true;
        }
        do {
          bVar3 = pIVar2 == pIVar1;
          if (bVar3) {
            return bVar3;
          }
          pIVar2 = pIVar2->ParentWindow;
        } while (pIVar2 != (ImGuiWindow *)0x0);
        return bVar3;
      }
      break;
    case 2:
      return pIVar2 == pIVar1->RootWindow;
    case 3:
      if (pIVar2 != (ImGuiWindow *)0x0) {
        return pIVar2->RootWindow == pIVar1->RootWindow;
      }
    }
    return false;
  }
  __assert_fail("g.CurrentWindow",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                ,0x18d9,"bool ImGui::IsWindowFocused(ImGuiFocusedFlags)");
}

Assistant:

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)
{
    ImGuiContext& g = *GImGui;

    if (flags & ImGuiFocusedFlags_AnyWindow)
        return g.NavWindow != NULL;

    IM_ASSERT(g.CurrentWindow);     // Not inside a Begin()/End()
    switch (flags & (ImGuiFocusedFlags_RootWindow | ImGuiFocusedFlags_ChildWindows))
    {
    case ImGuiFocusedFlags_RootWindow | ImGuiFocusedFlags_ChildWindows:
        return g.NavWindow && g.NavWindow->RootWindow == g.CurrentWindow->RootWindow;
    case ImGuiFocusedFlags_RootWindow:
        return g.NavWindow == g.CurrentWindow->RootWindow;
    case ImGuiFocusedFlags_ChildWindows:
        return g.NavWindow && IsWindowChildOf(g.NavWindow, g.CurrentWindow);
    default:
        return g.NavWindow == g.CurrentWindow;
    }
}